

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void jmp_dropval(FuncState *fs,BCPos list)

{
  undefined4 local_14;
  BCPos list_local;
  FuncState *fs_local;
  
  for (local_14 = list; local_14 != 0xffffffff; local_14 = jmp_next(fs,local_14)) {
    jmp_patchtestreg(fs,local_14,0xff);
  }
  return;
}

Assistant:

static void jmp_dropval(FuncState *fs, BCPos list)
{
  for (; list != NO_JMP; list = jmp_next(fs, list))
    jmp_patchtestreg(fs, list, NO_REG);
}